

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ArraySliceBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  vector<duckdb::LogicalType,_true> *this_00;
  LogicalTypeId LVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  element_type *peVar4;
  size_type sVar5;
  undefined8 uVar6;
  bool bVar7;
  bool end_is_empty_p;
  reference pvVar8;
  pointer pEVar9;
  reference pvVar10;
  LogicalType *other;
  ListSliceBindData *this_01;
  NotImplementedException *this_02;
  BinderException *this_03;
  idx_t i;
  size_type __n;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  LogicalType child_type;
  LogicalType target_type;
  string local_90;
  undefined1 local_70 [64];
  
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar8);
  LVar1 = (pEVar9->return_type).id_;
  local_70._32_8_ = this;
  if (LVar1 < LIST) {
    if (1 < LVar1 - 1) {
      if (1 < LVar1 - 0x19) {
LAB_00fa7d3b:
        this_03 = (BinderException *)__cxa_allocate_exception(0x10);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"ARRAY_SLICE can only operate on LISTs and VARCHARs","");
        BinderException::BinderException(this_03,&local_90);
        __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((long)(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x60) {
        this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,
                   "Slice with steps has not been implemented for string types, you can consider rewriting your query as follows:\n SELECT array_to_string((str_split(string, \'\')[begin:end:step], \'\');"
                   ,"");
        NotImplementedException::NotImplementedException(this_02,&local_90);
        __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      this_00 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar8);
      bVar7 = LogicalType::IsJSONType(&pEVar9->return_type);
      if (bVar7) {
        LogicalType::LogicalType((LogicalType *)&local_90,VARCHAR);
        pvVar10 = vector<duckdb::LogicalType,_true>::operator[](this_00,0);
        uVar6 = local_90.field_2._M_allocated_capacity;
        sVar5 = local_90._M_string_length;
        pvVar10->id_ = (LogicalTypeId)local_90._M_dataplus._M_p;
        pvVar10->physical_type_ = local_90._M_dataplus._M_p._1_1_;
        uVar11 = *(undefined4 *)
                  &(pvVar10->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar12 = *(undefined4 *)
                  ((long)&(pvVar10->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
        uVar13 = *(undefined4 *)
                  &(pvVar10->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
        uVar14 = *(undefined4 *)
                  ((long)&(pvVar10->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4);
        (pvVar10->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (pvVar10->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_90._M_string_length = 0;
        local_90.field_2._M_allocated_capacity = 0;
        p_Var2 = (pvVar10->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (pvVar10->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)sVar5;
        (pvVar10->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_70._8_4_ = uVar11;
          local_70._12_4_ = uVar12;
          local_70._16_4_ = uVar13;
          local_70._20_4_ = uVar14;
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          uVar11 = local_70._8_4_;
          uVar12 = local_70._12_4_;
          uVar13 = local_70._16_4_;
          uVar14 = local_70._20_4_;
        }
        uVar6 = local_90.field_2._M_allocated_capacity;
        local_90._M_string_length = CONCAT44(uVar12,uVar11);
        local_90.field_2._M_allocated_capacity._4_4_ = uVar14;
        local_90.field_2._M_allocated_capacity._0_4_ = uVar13;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
        }
        LogicalType::~LogicalType((LogicalType *)&local_90);
        LogicalType::LogicalType((LogicalType *)&local_90,VARCHAR);
        (bound_function->super_BaseScalarFunction).return_type.id_ =
             (LogicalTypeId)local_90._M_dataplus._M_p;
        (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
             local_90._M_dataplus._M_p._1_1_;
        peVar4 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var2 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_90._M_string_length;
        (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.field_2._M_allocated_capacity;
        local_90._M_string_length = (size_type)peVar4;
        local_90.field_2._M_allocated_capacity = (size_type)p_Var2;
        LogicalType::~LogicalType((LogicalType *)&local_90);
      }
      else {
        pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,0);
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar8);
        if (&(bound_function->super_BaseScalarFunction).return_type != &pEVar9->return_type) {
          (bound_function->super_BaseScalarFunction).return_type.id_ = (pEVar9->return_type).id_;
          (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
               (pEVar9->return_type).physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                     &(pEVar9->return_type).type_info_);
        }
      }
      __n = 1;
      do {
        pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,__n);
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar8);
        if ((pEVar9->return_type).id_ != LIST) {
          LogicalType::LogicalType((LogicalType *)&local_90,BIGINT);
          pvVar10 = vector<duckdb::LogicalType,_true>::operator[](this_00,__n);
          uVar6 = local_90.field_2._M_allocated_capacity;
          sVar5 = local_90._M_string_length;
          pvVar10->id_ = (LogicalTypeId)local_90._M_dataplus._M_p;
          pvVar10->physical_type_ = local_90._M_dataplus._M_p._1_1_;
          uVar11 = *(undefined4 *)
                    &(pvVar10->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar12 = *(undefined4 *)
                    ((long)&(pvVar10->type_info_).internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4);
          uVar13 = *(undefined4 *)
                    &(pvVar10->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
          uVar14 = *(undefined4 *)
                    ((long)&(pvVar10->type_info_).internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4);
          (pvVar10->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pvVar10->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_90._M_string_length = 0;
          local_90.field_2._M_allocated_capacity = 0;
          p_Var2 = (pvVar10->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          (pvVar10->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)sVar5;
          (pvVar10->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_70._8_4_ = uVar11;
            local_70._12_4_ = uVar12;
            local_70._16_4_ = uVar13;
            local_70._20_4_ = uVar14;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            uVar11 = local_70._8_4_;
            uVar12 = local_70._12_4_;
            uVar13 = local_70._16_4_;
            uVar14 = local_70._20_4_;
          }
          uVar6 = local_90.field_2._M_allocated_capacity;
          local_90._M_string_length = CONCAT44(uVar12,uVar11);
          local_90.field_2._M_allocated_capacity._4_4_ = uVar14;
          local_90.field_2._M_allocated_capacity._0_4_ = uVar13;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
          }
          LogicalType::~LogicalType((LogicalType *)&local_90);
        }
        __n = __n + 1;
      } while (__n != 3);
      goto LAB_00fa7b7c;
    }
    LogicalType::LogicalType((LogicalType *)&local_90,UNKNOWN);
    pvVar10 = vector<duckdb::LogicalType,_true>::operator[]
                        (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,
                         0);
    uVar6 = local_90.field_2._M_allocated_capacity;
    sVar5 = local_90._M_string_length;
    pvVar10->id_ = (LogicalTypeId)local_90._M_dataplus._M_p;
    pvVar10->physical_type_ = local_90._M_dataplus._M_p._1_1_;
    uVar11 = *(undefined4 *)
              &(pvVar10->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar12 = *(undefined4 *)
              ((long)&(pvVar10->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar13 = *(undefined4 *)
              &(pvVar10->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar14 = *(undefined4 *)
              ((long)&(pvVar10->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (pvVar10->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pvVar10->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_90._M_string_length = 0;
    local_90.field_2._M_allocated_capacity = 0;
    p_Var2 = (pvVar10->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (pvVar10->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)sVar5;
    (pvVar10->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_70._8_4_ = uVar11;
      local_70._12_4_ = uVar12;
      local_70._16_4_ = uVar13;
      local_70._20_4_ = uVar14;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      uVar11 = local_70._8_4_;
      uVar12 = local_70._12_4_;
      uVar13 = local_70._16_4_;
      uVar14 = local_70._20_4_;
    }
    uVar6 = local_90.field_2._M_allocated_capacity;
    local_90._M_string_length = CONCAT44(uVar12,uVar11);
    local_90.field_2._M_allocated_capacity._4_4_ = uVar14;
    local_90.field_2._M_allocated_capacity._0_4_ = uVar13;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
    }
    LogicalType::~LogicalType((LogicalType *)&local_90);
    LogicalType::LogicalType((LogicalType *)&local_90,SQLNULL);
    (bound_function->super_BaseScalarFunction).return_type.id_ =
         (LogicalTypeId)local_90._M_dataplus._M_p;
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
         local_90._M_dataplus._M_p._1_1_;
    peVar4 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_90._M_string_length;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.field_2._M_allocated_capacity;
    local_90._M_string_length = (size_type)peVar4;
    local_90.field_2._M_allocated_capacity = (size_type)p_Var2;
  }
  else {
    if (LVar1 == LIST) {
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar8);
      if (&(bound_function->super_BaseScalarFunction).return_type != &pEVar9->return_type) {
        (bound_function->super_BaseScalarFunction).return_type.id_ = (pEVar9->return_type).id_;
        (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
             (pEVar9->return_type).physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                   &(pEVar9->return_type).type_info_);
      }
      goto LAB_00fa7b7c;
    }
    if (LVar1 != 0x6c) goto LAB_00fa7d3b;
    pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar8);
    other = ArrayType::GetChildType(&pEVar9->return_type);
    LogicalType::LogicalType((LogicalType *)&local_90,other);
    LogicalType::LIST((LogicalType *)(local_70 + 0x28),(LogicalType *)&local_90);
    pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    local_70._24_8_ =
         (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)local_70,context,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               (local_70 + 0x18),(LogicalType *)(local_70 + 0x28),false);
    pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    uVar6 = local_70._0_8_;
    local_70._0_8_ = (_func_int **)0x0;
    _Var3._M_head_impl =
         (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar6;
    if (_Var3._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
    }
    if ((_func_int **)local_70._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_70._0_8_ + 8))();
    }
    local_70._0_8_ = (Expression *)0x0;
    if ((Expression *)local_70._24_8_ != (Expression *)0x0) {
      (*((BaseExpression *)local_70._24_8_)->_vptr_BaseExpression[1])();
    }
    local_70._24_8_ = 0;
    pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar8);
    if (&(bound_function->super_BaseScalarFunction).return_type != &pEVar9->return_type) {
      (bound_function->super_BaseScalarFunction).return_type.id_ = (pEVar9->return_type).id_;
      (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
           (pEVar9->return_type).physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                 &(pEVar9->return_type).type_info_);
    }
    LogicalType::~LogicalType((LogicalType *)(local_70 + 0x28));
  }
  LogicalType::~LogicalType((LogicalType *)&local_90);
LAB_00fa7b7c:
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  bVar7 = CheckIfParamIsEmpty(pvVar8);
  if (!bVar7) {
    LogicalType::LogicalType((LogicalType *)&local_90,BIGINT);
    pvVar10 = vector<duckdb::LogicalType,_true>::operator[]
                        (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,
                         1);
    uVar6 = local_90.field_2._M_allocated_capacity;
    sVar5 = local_90._M_string_length;
    pvVar10->id_ = (LogicalTypeId)local_90._M_dataplus._M_p;
    pvVar10->physical_type_ = local_90._M_dataplus._M_p._1_1_;
    uVar11 = *(undefined4 *)
              &(pvVar10->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar12 = *(undefined4 *)
              ((long)&(pvVar10->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar13 = *(undefined4 *)
              &(pvVar10->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar14 = *(undefined4 *)
              ((long)&(pvVar10->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (pvVar10->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pvVar10->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_90._M_string_length = 0;
    local_90.field_2._M_allocated_capacity = 0;
    p_Var2 = (pvVar10->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (pvVar10->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)sVar5;
    (pvVar10->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_70._8_4_ = uVar11;
      local_70._12_4_ = uVar12;
      local_70._16_4_ = uVar13;
      local_70._20_4_ = uVar14;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      uVar11 = local_70._8_4_;
      uVar12 = local_70._12_4_;
      uVar13 = local_70._16_4_;
      uVar14 = local_70._20_4_;
    }
    uVar6 = local_90.field_2._M_allocated_capacity;
    local_90._M_string_length = CONCAT44(uVar12,uVar11);
    local_90.field_2._M_allocated_capacity._4_4_ = uVar14;
    local_90.field_2._M_allocated_capacity._0_4_ = uVar13;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
    }
    LogicalType::~LogicalType((LogicalType *)&local_90);
  }
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,2);
  end_is_empty_p = CheckIfParamIsEmpty(pvVar8);
  if (!end_is_empty_p) {
    LogicalType::LogicalType((LogicalType *)&local_90,BIGINT);
    pvVar10 = vector<duckdb::LogicalType,_true>::operator[]
                        (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,
                         2);
    uVar6 = local_90.field_2._M_allocated_capacity;
    sVar5 = local_90._M_string_length;
    pvVar10->id_ = (LogicalTypeId)local_90._M_dataplus._M_p;
    pvVar10->physical_type_ = local_90._M_dataplus._M_p._1_1_;
    uVar11 = *(undefined4 *)
              &(pvVar10->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar12 = *(undefined4 *)
              ((long)&(pvVar10->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar13 = *(undefined4 *)
              &(pvVar10->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar14 = *(undefined4 *)
              ((long)&(pvVar10->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (pvVar10->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pvVar10->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_90._M_string_length = 0;
    local_90.field_2._M_allocated_capacity = 0;
    p_Var2 = (pvVar10->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (pvVar10->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)sVar5;
    (pvVar10->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_70._8_4_ = uVar11;
      local_70._12_4_ = uVar12;
      local_70._16_4_ = uVar13;
      local_70._20_4_ = uVar14;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      uVar11 = local_70._8_4_;
      uVar12 = local_70._12_4_;
      uVar13 = local_70._16_4_;
      uVar14 = local_70._20_4_;
    }
    uVar6 = local_90.field_2._M_allocated_capacity;
    local_90._M_string_length = CONCAT44(uVar12,uVar11);
    local_90.field_2._M_allocated_capacity._4_4_ = uVar14;
    local_90.field_2._M_allocated_capacity._0_4_ = uVar13;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
    }
    LogicalType::~LogicalType((LogicalType *)&local_90);
  }
  this_01 = (ListSliceBindData *)operator_new(0x28);
  ListSliceBindData::ListSliceBindData
            (this_01,&(bound_function->super_BaseScalarFunction).return_type,bVar7,end_is_empty_p);
  *(ListSliceBindData **)local_70._32_8_ = this_01;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         local_70._32_8_;
}

Assistant:

static unique_ptr<FunctionData> ArraySliceBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(arguments.size() == 3 || arguments.size() == 4);
	D_ASSERT(bound_function.arguments.size() == 3 || bound_function.arguments.size() == 4);

	switch (arguments[0]->return_type.id()) {
	case LogicalTypeId::ARRAY: {
		// Cast to list
		auto child_type = ArrayType::GetChildType(arguments[0]->return_type);
		auto target_type = LogicalType::LIST(child_type);
		arguments[0] = BoundCastExpression::AddCastToType(context, std::move(arguments[0]), target_type);
		bound_function.return_type = arguments[0]->return_type;
	} break;
	case LogicalTypeId::LIST:
		// The result is the same type
		bound_function.return_type = arguments[0]->return_type;
		break;
	case LogicalTypeId::BLOB:
	case LogicalTypeId::VARCHAR:
		// string slice returns a string
		if (bound_function.arguments.size() == 4) {
			throw NotImplementedException(
			    "Slice with steps has not been implemented for string types, you can consider rewriting your query as "
			    "follows:\n SELECT array_to_string((str_split(string, '')[begin:end:step], '');");
		}
		if (arguments[0]->return_type.IsJSONType()) {
			// This is needed to avoid producing invalid JSON
			bound_function.arguments[0] = LogicalType::VARCHAR;
			bound_function.return_type = LogicalType::VARCHAR;
		} else {
			bound_function.return_type = arguments[0]->return_type;
		}
		for (idx_t i = 1; i < 3; i++) {
			if (arguments[i]->return_type.id() != LogicalTypeId::LIST) {
				bound_function.arguments[i] = LogicalType::BIGINT;
			}
		}
		break;
	case LogicalTypeId::SQLNULL:
	case LogicalTypeId::UNKNOWN:
		bound_function.arguments[0] = LogicalTypeId::UNKNOWN;
		bound_function.return_type = LogicalType::SQLNULL;
		break;
	default:
		throw BinderException("ARRAY_SLICE can only operate on LISTs and VARCHARs");
	}

	bool begin_is_empty = CheckIfParamIsEmpty(arguments[1]);
	if (!begin_is_empty) {
		bound_function.arguments[1] = LogicalType::BIGINT;
	}
	bool end_is_empty = CheckIfParamIsEmpty(arguments[2]);
	if (!end_is_empty) {
		bound_function.arguments[2] = LogicalType::BIGINT;
	}

	return make_uniq<ListSliceBindData>(bound_function.return_type, begin_is_empty, end_is_empty);
}